

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O2

bool __thiscall ON_Matrix::Scale(ON_Matrix *this,double s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  long lVar6;
  void **ppvVar7;
  
  iVar1 = this->m_row_count;
  iVar2 = this->m_col_count;
  if (0 < iVar2 && 0 < iVar1) {
    ppvVar7 = &this->m_cmem;
    while (piVar4 = (int *)*ppvVar7, piVar4 != (int *)0x0) {
      lVar5 = *(long *)(piVar4 + 2);
      if ((lVar5 != 0) && (iVar3 = *piVar4, 0 < iVar3)) {
        for (lVar6 = 0; iVar3 != (int)lVar6; lVar6 = lVar6 + 1) {
          *(double *)(lVar5 + lVar6 * 8) = *(double *)(lVar5 + lVar6 * 8) * s;
        }
      }
      ppvVar7 = (void **)(piVar4 + 4);
    }
  }
  return 0 < iVar2 && 0 < iVar1;
}

Assistant:

bool ON_Matrix::Scale( double s )
{
  bool rc = false;
  if ( m_row_count > 0 && m_col_count > 0 ) 
  {
    struct DBLBLK* cmem = (struct DBLBLK*)m_cmem;
    int i;
    double* p;
    while ( 0 != cmem )
    {
      if ( 0 != cmem->a && cmem->count > 0 )
      {
        p = cmem->a;
        i = cmem->count;
        while(i--)
          *p++ *= s;
      }
      cmem = cmem->next;
    }
    rc = true;
  }
  /*
  int i = m_a.Capacity();
  if ( m_row_count > 0 && m_col_count > 0 && m_row_count*m_col_count <= i ) {
    double* p = m_a.Array();
    while ( i-- )
      *p++ *= s;
    rc = true;
  }
  */
  return rc;
}